

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

void highbd_hadamard_col8_avx2(__m256i *in,int iter)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  __m256i alVar19;
  
  auVar1 = vpaddd_avx2((undefined1  [32])in[1],(undefined1  [32])*in);
  auVar9 = vpsubd_avx2((undefined1  [32])*in,(undefined1  [32])in[1]);
  auVar2 = vpaddd_avx2((undefined1  [32])in[3],(undefined1  [32])in[2]);
  auVar10 = vpsubd_avx2((undefined1  [32])in[2],(undefined1  [32])in[3]);
  auVar3 = vpaddd_avx2((undefined1  [32])in[5],(undefined1  [32])in[4]);
  auVar11 = vpsubd_avx2((undefined1  [32])in[4],(undefined1  [32])in[5]);
  auVar4 = vpaddd_avx2((undefined1  [32])in[7],(undefined1  [32])in[6]);
  auVar12 = vpsubd_avx2((undefined1  [32])in[6],(undefined1  [32])in[7]);
  auVar5 = vpaddd_avx2(auVar1,auVar2);
  auVar6 = vpaddd_avx2(auVar10,auVar9);
  auVar13 = vpsubd_avx2(auVar1,auVar2);
  auVar9 = vpsubd_avx2(auVar9,auVar10);
  auVar1 = vpaddd_avx2(auVar4,auVar3);
  auVar2 = vpaddd_avx2(auVar12,auVar11);
  auVar3 = vpsubd_avx2(auVar3,auVar4);
  auVar4 = vpsubd_avx2(auVar11,auVar12);
  alVar16 = (__m256i)vpaddd_avx2(auVar1,auVar5);
  alVar7 = (__m256i)vpaddd_avx2(auVar2,auVar6);
  alVar8 = (__m256i)vpaddd_avx2(auVar3,auVar13);
  alVar17 = (__m256i)vpaddd_avx2(auVar9,auVar4);
  alVar19 = (__m256i)vpsubd_avx2(auVar5,auVar1);
  alVar18 = (__m256i)vpsubd_avx2(auVar6,auVar2);
  alVar14 = (__m256i)vpsubd_avx2(auVar13,auVar3);
  alVar15 = (__m256i)vpsubd_avx2(auVar9,auVar4);
  if (iter == 0) {
    auVar5 = vpunpckldq_avx2((undefined1  [32])alVar16,(undefined1  [32])alVar14);
    auVar6 = vpunpckldq_avx2((undefined1  [32])alVar19,(undefined1  [32])alVar8);
    auVar1 = vpunpckhdq_avx2((undefined1  [32])alVar16,(undefined1  [32])alVar14);
    auVar2 = vpunpckhdq_avx2((undefined1  [32])alVar19,(undefined1  [32])alVar8);
    auVar9 = vpunpckldq_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar15);
    auVar10 = vpunpckldq_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar7);
    auVar3 = vpunpckhdq_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar15);
    auVar4 = vpunpckhdq_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar7);
    auVar11 = vpunpcklqdq_avx2(auVar5,auVar6);
    auVar12 = vpunpcklqdq_avx2(auVar9,auVar10);
    auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
    auVar6 = vpunpckhqdq_avx2(auVar9,auVar10);
    auVar9 = vpunpcklqdq_avx2(auVar1,auVar2);
    auVar10 = vpunpcklqdq_avx2(auVar3,auVar4);
    auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
    auVar2 = vpunpckhqdq_avx2(auVar3,auVar4);
    alVar16._0_16_ = ZEXT116(0) * auVar12._0_16_ + ZEXT116(1) * auVar11._0_16_;
    alVar16._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar12._0_16_;
    alVar14 = (__m256i)vperm2i128_avx2(auVar11,auVar12,0x31);
    alVar19._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
    alVar19._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
    alVar8 = (__m256i)vperm2i128_avx2(auVar5,auVar6,0x31);
    alVar17._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar9._0_16_;
    alVar17._16_16_ = ZEXT116(0) * auVar9._16_16_ + ZEXT116(1) * auVar10._0_16_;
    alVar15 = (__m256i)vperm2i128_avx2(auVar9,auVar10,0x31);
    alVar18._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar1._0_16_;
    alVar18._16_16_ = ZEXT116(0) * auVar1._16_16_ + ZEXT116(1) * auVar2._0_16_;
    alVar7 = (__m256i)vperm2i128_avx2(auVar1,auVar2,0x31);
  }
  *in = alVar16;
  in[1] = alVar14;
  in[2] = alVar19;
  in[3] = alVar8;
  in[4] = alVar17;
  in[5] = alVar15;
  in[6] = alVar18;
  in[7] = alVar7;
  return;
}

Assistant:

static void highbd_hadamard_col8_avx2(__m256i *in, int iter) {
  __m256i a0 = in[0];
  __m256i a1 = in[1];
  __m256i a2 = in[2];
  __m256i a3 = in[3];
  __m256i a4 = in[4];
  __m256i a5 = in[5];
  __m256i a6 = in[6];
  __m256i a7 = in[7];

  __m256i b0 = _mm256_add_epi32(a0, a1);
  __m256i b1 = _mm256_sub_epi32(a0, a1);
  __m256i b2 = _mm256_add_epi32(a2, a3);
  __m256i b3 = _mm256_sub_epi32(a2, a3);
  __m256i b4 = _mm256_add_epi32(a4, a5);
  __m256i b5 = _mm256_sub_epi32(a4, a5);
  __m256i b6 = _mm256_add_epi32(a6, a7);
  __m256i b7 = _mm256_sub_epi32(a6, a7);

  a0 = _mm256_add_epi32(b0, b2);
  a1 = _mm256_add_epi32(b1, b3);
  a2 = _mm256_sub_epi32(b0, b2);
  a3 = _mm256_sub_epi32(b1, b3);
  a4 = _mm256_add_epi32(b4, b6);
  a5 = _mm256_add_epi32(b5, b7);
  a6 = _mm256_sub_epi32(b4, b6);
  a7 = _mm256_sub_epi32(b5, b7);

  if (iter == 0) {
    b0 = _mm256_add_epi32(a0, a4);
    b7 = _mm256_add_epi32(a1, a5);
    b3 = _mm256_add_epi32(a2, a6);
    b4 = _mm256_add_epi32(a3, a7);
    b2 = _mm256_sub_epi32(a0, a4);
    b6 = _mm256_sub_epi32(a1, a5);
    b1 = _mm256_sub_epi32(a2, a6);
    b5 = _mm256_sub_epi32(a3, a7);

    a0 = _mm256_unpacklo_epi32(b0, b1);
    a1 = _mm256_unpacklo_epi32(b2, b3);
    a2 = _mm256_unpackhi_epi32(b0, b1);
    a3 = _mm256_unpackhi_epi32(b2, b3);
    a4 = _mm256_unpacklo_epi32(b4, b5);
    a5 = _mm256_unpacklo_epi32(b6, b7);
    a6 = _mm256_unpackhi_epi32(b4, b5);
    a7 = _mm256_unpackhi_epi32(b6, b7);

    b0 = _mm256_unpacklo_epi64(a0, a1);
    b1 = _mm256_unpacklo_epi64(a4, a5);
    b2 = _mm256_unpackhi_epi64(a0, a1);
    b3 = _mm256_unpackhi_epi64(a4, a5);
    b4 = _mm256_unpacklo_epi64(a2, a3);
    b5 = _mm256_unpacklo_epi64(a6, a7);
    b6 = _mm256_unpackhi_epi64(a2, a3);
    b7 = _mm256_unpackhi_epi64(a6, a7);

    in[0] = _mm256_permute2x128_si256(b0, b1, 0x20);
    in[1] = _mm256_permute2x128_si256(b0, b1, 0x31);
    in[2] = _mm256_permute2x128_si256(b2, b3, 0x20);
    in[3] = _mm256_permute2x128_si256(b2, b3, 0x31);
    in[4] = _mm256_permute2x128_si256(b4, b5, 0x20);
    in[5] = _mm256_permute2x128_si256(b4, b5, 0x31);
    in[6] = _mm256_permute2x128_si256(b6, b7, 0x20);
    in[7] = _mm256_permute2x128_si256(b6, b7, 0x31);
  } else {
    in[0] = _mm256_add_epi32(a0, a4);
    in[7] = _mm256_add_epi32(a1, a5);
    in[3] = _mm256_add_epi32(a2, a6);
    in[4] = _mm256_add_epi32(a3, a7);
    in[2] = _mm256_sub_epi32(a0, a4);
    in[6] = _mm256_sub_epi32(a1, a5);
    in[1] = _mm256_sub_epi32(a2, a6);
    in[5] = _mm256_sub_epi32(a3, a7);
  }
}